

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadBB3D(B3DImporter *this,aiScene *scene)

{
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *v;
  float fVar1;
  float fVar2;
  float fVar3;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar4;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *puVar5;
  pointer pVVar6;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar7;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *puVar8;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar9;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *puVar10;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar11;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *puVar12;
  pointer puVar13;
  __uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> _Var14;
  pointer puVar15;
  aiAnimation *paVar16;
  undefined1 auVar17 [16];
  int iVar18;
  aiNode *paVar19;
  _func_int **pp_Var20;
  void *__src;
  aiScene *pScene;
  bool bVar21;
  int iVar22;
  uint uVar23;
  Logger *this_00;
  ulong uVar24;
  ulong uVar25;
  undefined8 *__s;
  aiNode *paVar26;
  aiVertexWeight *paVar27;
  aiMatrix4x4t<float> *paVar28;
  aiBone **__dest;
  pointer ppaVar29;
  aiVertexWeight this_01;
  aiMaterial **ppaVar30;
  aiMesh **ppaVar31;
  aiNodeAnim **ppaVar32;
  aiAnimation **ppaVar33;
  ulong uVar34;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *this_02;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *this_03;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *this_04;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *this_05;
  undefined8 *__s_00;
  long lVar35;
  long lVar36;
  B3DImporter *pBVar37;
  long lVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  aiBone *bone;
  FlipWindingOrderProcess flip;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  MakeLeftHandedProcess makeleft;
  string t;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  ulong local_218;
  float local_1f8;
  float local_1f4;
  undefined8 *local_1f0;
  aiNode *local_1e8;
  FlipWindingOrderProcess local_1e0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  void *local_168;
  iterator iStack_160;
  aiBone **local_158;
  undefined1 local_148 [12];
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  undefined8 uStack_110;
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  *local_c8;
  _Head_base<0UL,_aiMesh_*,_false> local_c0;
  aiScene *local_b8;
  ulong local_b0;
  aiNode *local_a8;
  ulong local_a0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  local_b8 = scene;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->_textures,
                    (this->_textures).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  puVar4 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->_materials).
           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = puVar4;
  if (puVar5 != puVar4) {
    do {
      std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != puVar5);
    (this->_materials).
    super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  pVVar6 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_vertices).
      super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar6) {
    (this->_vertices).
    super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar6;
  }
  puVar7 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (this->_meshes).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = puVar7;
  if (puVar8 != puVar7) {
    do {
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != puVar8);
    (this->_meshes).
    super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  local_98 = &this->_nodes;
  DeleteAllBarePointers<aiNode*>(local_98);
  ppaVar29 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar29) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar29;
  }
  puVar9 = (this->_nodeAnims).
           super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->_nodeAnims).
            super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = puVar9;
  if (puVar10 != puVar9) {
    do {
      std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != puVar10);
    (this->_nodeAnims).
    super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  puVar11 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = puVar11;
  if (puVar12 != puVar11) {
    do {
      std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != puVar12);
    (this->_animations).
    super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar11;
  }
  ReadChunk_abi_cxx11_(&local_50,this);
  iVar22 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar22 == 0) {
    uVar23 = ReadInt(this);
    bVar21 = DefaultLogger::isNullLogger();
    if (!bVar21) {
      snprintf(local_148,0x80,"B3D file format version: %i",(ulong)uVar23);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,local_148);
    }
    if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] != this->_pos) {
      do {
        ReadChunk_abi_cxx11_((string *)local_148,this);
        iVar22 = std::__cxx11::string::compare((char *)local_148);
        if (iVar22 == 0) {
          ReadTEXS(this);
        }
        else {
          iVar22 = std::__cxx11::string::compare((char *)local_148);
          if (iVar22 == 0) {
            ReadBRUS(this);
          }
          else {
            iVar22 = std::__cxx11::string::compare((char *)local_148);
            if (iVar22 == 0) {
              ReadNODE(this,(aiNode *)0x0);
            }
          }
        }
        puVar13 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        this->_pos = puVar13[-1];
        (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar13 + -1;
        if ((undefined1 *)local_148._0_8_ != local_138) {
          operator_delete((void *)local_148._0_8_,(long)local_138 + 1);
        }
      } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1] != this->_pos);
    }
  }
  puVar13 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar29 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this->_pos = puVar13[-1];
  (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar13 + -1;
  if (ppaVar29 ==
      (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_70._0_8_ = local_70 + 0x10;
    pBVar37 = (B3DImporter *)local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar37,"No nodes","");
    Fail(pBVar37,(string *)local_70);
  }
  if ((this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_meshes).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_90._0_8_ = local_90 + 0x10;
    pBVar37 = (B3DImporter *)local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)pBVar37,"No meshes","");
    Fail(pBVar37,(string *)local_90);
  }
  local_c8 = &this->_meshes;
  ppaVar29 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar29) {
    uVar24 = 0;
    do {
      local_b0 = uVar24;
      if (ppaVar29[uVar24]->mNumMeshes != 0) {
        uVar34 = 0;
        local_a8 = ppaVar29[uVar24];
        do {
          _Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
               (local_c8->
               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[local_a8->mMeshes[uVar34]]._M_t.
               super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t;
          iVar22 = *(int *)((long)_Var14._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
          iVar18 = iVar22 * 3;
          uVar24 = (ulong)iVar18;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar24;
          uVar25 = SUB168(auVar17 * ZEXT816(0xc),0);
          *(int *)((long)_Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = iVar18;
          if (SUB168(auVar17 * ZEXT816(0xc),8) != 0) {
            uVar25 = 0xffffffffffffffff;
          }
          local_a0 = uVar34;
          __s = (undefined8 *)operator_new__(uVar25);
          if (iVar22 != 0) {
            memset(__s,0,((uVar24 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(undefined8 **)
           ((long)_Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = __s;
          if ((this->_vflags & 1) == 0) {
            __s_00 = (undefined8 *)0x0;
          }
          else {
            __s_00 = (undefined8 *)operator_new__(uVar25);
            if (iVar22 != 0) {
              memset(__s_00,0,((uVar24 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(undefined8 **)
             ((long)_Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = __s_00;
          }
          if (this->_tcsets == 0) {
            local_1f0 = (undefined8 *)0x0;
          }
          else {
            local_1f0 = (undefined8 *)operator_new__(uVar25);
            if (iVar22 != 0) {
              memset(local_1f0,0,((uVar24 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(undefined8 **)
             ((long)_Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70) = local_1f0;
          }
          lVar36 = *(long *)((long)_Var14._M_t.
                                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_1e0,
                   (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_148);
          local_c0._M_head_impl =
               (aiMesh *)
               _Var14._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
               super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
          if (0 < iVar22) {
            iVar22 = 0;
            do {
              lVar35 = 0;
              do {
                uVar24 = (ulong)*(uint *)(*(long *)(lVar36 + 8) + lVar35 * 4);
                pVVar6 = (this->_vertices).
                         super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(float *)(__s + 1) = pVVar6[uVar24].vertex.z;
                *__s = *(undefined8 *)&pVVar6[uVar24].vertex;
                if (__s_00 == (undefined8 *)0x0) {
                  __s_00 = (undefined8 *)0x0;
                }
                else {
                  *(float *)(__s_00 + 1) = pVVar6[uVar24].normal.z;
                  *__s_00 = *(undefined8 *)&pVVar6[uVar24].normal;
                  __s_00 = (undefined8 *)((long)__s_00 + 0xc);
                }
                if (local_1f0 == (undefined8 *)0x0) {
                  local_1f0 = (undefined8 *)0x0;
                }
                else {
                  *(float *)(local_1f0 + 1) = pVVar6[uVar24].texcoords.z;
                  *local_1f0 = *(undefined8 *)&pVVar6[uVar24].texcoords;
                  local_1f0 = (undefined8 *)((long)local_1f0 + 0xc);
                }
                __s = (undefined8 *)((long)__s + 0xc);
                uVar23 = iVar22 + (int)lVar35;
                *(uint *)(*(long *)(lVar36 + 8) + lVar35 * 4) = uVar23;
                lVar38 = -4;
                do {
                  fVar45 = *(float *)(pVVar6[uVar24 + 1].bones + lVar38 * 4 + -0x24);
                  if ((fVar45 == 0.0) && (!NAN(fVar45))) break;
                  local_148._4_4_ = fVar45;
                  local_148._0_4_ = uVar23;
                  std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                  emplace_back<aiVertexWeight>
                            ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                             ((long)&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)
                                     ->_M_t)._M_impl.field_0x0 +
                             (ulong)((uint)*(byte *)((long)pVVar6[uVar24].weights + lVar38) * 0x18))
                             ,(aiVertexWeight *)local_148);
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0);
                lVar35 = lVar35 + 1;
              } while (lVar35 != 3);
              lVar36 = lVar36 + 0x10;
              iVar22 = iVar22 + 3;
            } while (iVar22 < iVar18);
          }
          local_168 = (void *)0x0;
          iStack_160._M_current = (aiBone **)0x0;
          local_158 = (aiBone **)0x0;
          if (local_1e0.super_BaseProcess.shared !=
              (SharedPostProcessInfo *)local_1e0.super_BaseProcess._vptr_BaseProcess) {
            uVar24 = 0;
            do {
              pp_Var20 = local_1e0.super_BaseProcess._vptr_BaseProcess;
              if (*(_func_int **)
                   (&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)->_M_t)._M_impl.
                     super__Rb_tree_header._M_header._M_color + uVar24 * 6) !=
                  *(_func_int **)
                   ((long)&(((PropertyMap *)local_1e0.super_BaseProcess._vptr_BaseProcess)->_M_t).
                           _M_impl.field_0x0 + uVar24 * 3 * 8)) {
                paVar26 = (aiNode *)operator_new(0x450);
                (paVar26->mName).length = 0;
                (paVar26->mName).data[0] = '\0';
                memset((paVar26->mName).data + 1,0x1b,0x3ff);
                (paVar26->mTransformation).a1 = 0.0;
                (paVar26->mTransformation).a2 = 0.0;
                (paVar26->mTransformation).a3 = 0.0;
                (paVar26->mTransformation).a4 = 1.0;
                (paVar26->mTransformation).b1 = 0.0;
                (paVar26->mTransformation).b2 = 0.0;
                (paVar26->mTransformation).b3 = 0.0;
                (paVar26->mTransformation).b4 = 0.0;
                (paVar26->mTransformation).c1 = 1.0;
                (paVar26->mTransformation).c2 = 0.0;
                (paVar26->mTransformation).c3 = 0.0;
                (paVar26->mTransformation).c4 = 0.0;
                (paVar26->mTransformation).d1 = 0.0;
                (paVar26->mTransformation).d2 = 1.0;
                (paVar26->mTransformation).d3 = 0.0;
                (paVar26->mTransformation).d4 = 0.0;
                *(undefined8 *)&paVar26->field_0x444 = 0;
                *(undefined4 *)((long)&paVar26->mParent + 4) = 0x3f800000;
                local_1e8 = paVar26;
                if (iStack_160._M_current == local_158) {
                  std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                            ((vector<aiBone*,std::allocator<aiBone*>> *)&local_168,iStack_160,
                             (aiBone **)&local_1e8);
                }
                else {
                  *iStack_160._M_current = (aiBone *)paVar26;
                  iStack_160._M_current = iStack_160._M_current + 1;
                }
                paVar19 = local_1e8;
                paVar26 = (local_98->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar24];
                if (local_1e8 != paVar26) {
                  uVar23 = (paVar26->mName).length;
                  (local_1e8->mName).length = uVar23;
                  memcpy((local_1e8->mName).data,(paVar26->mName).data,(ulong)uVar23);
                  (paVar19->mName).data[uVar23] = '\0';
                }
                v = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                    ((long)&(((PropertyMap *)pp_Var20)->_M_t)._M_impl.field_0x0 + uVar24 * 3 * 8);
                (local_1e8->mTransformation).a1 =
                     (float)((ulong)((long)(v->
                                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(v->
                                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
                paVar27 = to_array<aiVertexWeight>(this,v);
                *(aiVertexWeight **)&(local_1e8->mTransformation).a2 = paVar27;
                local_148._0_4_ = (paVar26->mTransformation).a1;
                local_148._4_4_ = (paVar26->mTransformation).a2;
                unique0x10000800 = *(SharedPostProcessInfo **)&(paVar26->mTransformation).a3;
                local_138 = *(undefined1 (*) [8])&(paVar26->mTransformation).b1;
                fStack_130 = (paVar26->mTransformation).b3;
                fStack_12c = (paVar26->mTransformation).b4;
                local_128 = (paVar26->mTransformation).c1;
                fStack_124 = (paVar26->mTransformation).c2;
                fStack_120 = (paVar26->mTransformation).c3;
                fStack_11c = (paVar26->mTransformation).c4;
                local_118 = (paVar26->mTransformation).d1;
                fStack_114 = (paVar26->mTransformation).d2;
                uStack_110._0_4_ = (paVar26->mTransformation).d3;
                uStack_110._4_4_ = (paVar26->mTransformation).d4;
                paVar26 = paVar26->mParent;
                if (paVar26 != (aiNode *)0x0) {
                  local_1f8 = local_118;
                  local_138._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
                  local_220 = fStack_124;
                  local_1f4 = fStack_114;
                  local_22c = (float)local_148._8_4_;
                  local_224 = fStack_120;
                  local_21c = (float)(undefined4)uStack_110;
                  fStack_13c = (float)((ulong)unique0x10000800 >> 0x20);
                  local_230 = fStack_13c;
                  local_228 = fStack_11c;
                  local_218 = uStack_110 >> 0x20;
                  do {
                    fVar45 = (paVar26->mTransformation).a1;
                    local_1a4 = (paVar26->mTransformation).a2;
                    fVar44 = (paVar26->mTransformation).a3;
                    local_1ac = (paVar26->mTransformation).b2;
                    local_16c = local_1ac * (float)local_138._0_4_;
                    local_1b0 = (paVar26->mTransformation).c2;
                    local_170 = local_1b0 * (float)local_138._0_4_;
                    fVar40 = (paVar26->mTransformation).d2;
                    local_1b4 = (paVar26->mTransformation).d1;
                    fVar42 = (paVar26->mTransformation).d3;
                    local_174 = local_128 * fVar42 +
                                (float)local_148._0_4_ * local_1b4 + (float)local_138._0_4_ * fVar40
                    ;
                    local_190 = (paVar26->mTransformation).b1;
                    local_1a8 = (float)local_148._0_4_ * local_190;
                    local_198 = local_1ac * (float)local_138._4_4_;
                    local_1a0 = (float)local_148._4_4_ * local_190;
                    local_194 = local_1ac * fStack_130;
                    local_1b8 = local_22c;
                    local_19c = local_22c * local_190;
                    local_190 = local_190 * local_230;
                    local_178 = (paVar26->mTransformation).c1;
                    local_18c = (float)local_148._0_4_ * local_178;
                    local_180 = local_1b0 * (float)local_138._4_4_;
                    local_188 = (float)local_148._4_4_ * local_178;
                    local_17c = local_1b0 * fStack_130;
                    local_184 = local_22c * local_178;
                    local_178 = local_178 * local_230;
                    fVar48 = (float)local_138._4_4_ * fVar40;
                    local_1bc = fStack_130 * fVar40;
                    fVar40 = fVar40 * fStack_12c;
                    fVar43 = local_230 * local_1b4;
                    fVar1 = (paVar26->mTransformation).b3;
                    local_1c4 = local_128 * fVar1;
                    local_1c0 = local_224 * fVar1;
                    fVar2 = (paVar26->mTransformation).c3;
                    fVar41 = local_228 * fVar42;
                    fVar3 = (paVar26->mTransformation).a4;
                    local_148._0_4_ =
                         local_1f8 * fVar3 +
                         local_128 * fVar44 +
                         (float)local_148._0_4_ * fVar45 + local_1a4 * (float)local_138._0_4_;
                    fVar47 = (float)local_148._4_4_ * local_1b4;
                    fVar46 = local_220 * fVar42;
                    local_148._4_4_ =
                         local_1f4 * fVar3 +
                         local_220 * fVar44 +
                         (float)local_148._4_4_ * fVar45 + local_1a4 * (float)local_138._4_4_;
                    fVar39 = local_22c * local_1b4;
                    fVar42 = local_224 * fVar42;
                    local_22c = local_21c * fVar3 +
                                local_224 * fVar44 + local_22c * fVar45 + local_1a4 * fStack_130;
                    local_230 = fVar3 * (float)local_218 +
                                fVar44 * local_228 + fVar45 * local_230 + local_1a4 * fStack_12c;
                    fVar44 = local_1b0 * fStack_12c;
                    fVar45 = (paVar26->mTransformation).b4;
                    local_138._0_4_ = local_1f8 * fVar45 + local_1c4 + local_1a8 + local_16c;
                    local_138._4_4_ = local_1f4 * fVar45 + local_220 * fVar1 + local_1a0 + local_198
                    ;
                    fStack_130 = local_21c * fVar45 + local_1c0 + local_19c + local_194;
                    fStack_12c = fVar45 * (float)local_218 +
                                 fVar1 * local_228 + local_190 + local_1ac * fStack_12c;
                    fVar45 = (paVar26->mTransformation).c4;
                    local_128 = local_1f8 * fVar45 + local_128 * fVar2 + local_18c + local_170;
                    local_220 = local_1f4 * fVar45 + local_220 * fVar2 + local_188 + local_180;
                    local_224 = local_21c * fVar45 + local_224 * fVar2 + local_184 + local_17c;
                    local_228 = fVar45 * (float)local_218 + fVar2 * local_228 + local_178 + fVar44;
                    fVar45 = (paVar26->mTransformation).d4;
                    local_1f8 = local_1f8 * fVar45 + local_174;
                    local_1f4 = local_1f4 * fVar45 + fVar46 + fVar47 + fVar48;
                    local_21c = local_21c * fVar45 + fVar42 + fVar39 + local_1bc;
                    fVar45 = (float)local_218 * fVar45 + fVar41 + fVar43 + fVar40;
                    local_218 = (ulong)(uint)fVar45;
                    paVar26 = paVar26->mParent;
                  } while (paVar26 != (aiNode *)0x0);
                  fStack_124 = local_220;
                  fStack_114 = local_1f4;
                  local_118 = local_1f8;
                  stack0xfffffffffffffec0 = (SharedPostProcessInfo *)CONCAT44(local_230,local_22c);
                  fStack_11c = local_228;
                  fStack_120 = local_224;
                  uStack_110 = CONCAT44(fVar45,local_21c);
                }
                paVar28 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_148);
                fVar41 = paVar28->a1;
                fVar43 = paVar28->a2;
                fVar46 = paVar28->a3;
                fVar47 = paVar28->a4;
                fVar1 = paVar28->b1;
                fVar2 = paVar28->b2;
                fVar3 = paVar28->b3;
                fVar39 = paVar28->b4;
                fVar45 = paVar28->c1;
                fVar44 = paVar28->c2;
                fVar40 = paVar28->c3;
                fVar42 = paVar28->c4;
                paVar26 = *(aiNode **)&paVar28->d3;
                *(undefined8 *)&(local_1e8->mTransformation).d4 = *(undefined8 *)&paVar28->d1;
                local_1e8->mParent = paVar26;
                (local_1e8->mTransformation).c4 = fVar45;
                (local_1e8->mTransformation).d1 = fVar44;
                (local_1e8->mTransformation).d2 = fVar40;
                (local_1e8->mTransformation).d3 = fVar42;
                (local_1e8->mTransformation).b4 = fVar1;
                (local_1e8->mTransformation).c1 = fVar2;
                (local_1e8->mTransformation).c2 = fVar3;
                (local_1e8->mTransformation).c3 = fVar39;
                (local_1e8->mTransformation).a4 = fVar41;
                (local_1e8->mTransformation).b1 = fVar43;
                (local_1e8->mTransformation).b2 = fVar46;
                (local_1e8->mTransformation).b3 = fVar47;
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 < (ulong)(((long)local_1e0.super_BaseProcess.shared -
                                       (long)local_1e0.super_BaseProcess._vptr_BaseProcess >> 3) *
                                     -0x5555555555555555));
          }
          __src = local_168;
          uVar24 = (long)iStack_160._M_current - (long)local_168 >> 3;
          *(uint *)((long)local_c0._M_head_impl + 0xd8) = (uint)uVar24;
          if ((long)iStack_160._M_current - (long)local_168 == 0) {
            __dest = (aiBone **)0x0;
          }
          else {
            __dest = (aiBone **)
                     operator_new__(-(ulong)(uVar24 >> 0x3d != 0) |
                                    (long)iStack_160._M_current - (long)local_168);
            memcpy(__dest,__src,(uVar24 + (uVar24 == 0)) * 8);
          }
          (local_c0._M_head_impl)->mBones = __dest;
          if (__src != (void *)0x0) {
            operator_delete(__src,(long)local_158 - (long)__src);
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_1e0);
          uVar34 = local_a0 + 1;
        } while (uVar34 < local_a8->mNumMeshes);
      }
      uVar24 = local_b0 + 1;
      ppaVar29 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)((long)(this->_nodes).
                                    super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppaVar29 >> 3));
  }
  pScene = local_b8;
  local_b8->mRootNode = *ppaVar29;
  ppaVar29 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppaVar29) {
    (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar29;
  }
  if ((this->_materials).
      super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_materials).
      super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_01 = (aiVertexWeight)operator_new(0x10);
    aiMaterial::aiMaterial((aiMaterial *)this_01);
    local_148._0_8_ = this_01;
    std::
    vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
    ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
              ((vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                *)&this->_materials,
               (unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_148);
    std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
              ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)local_148);
  }
  pScene->mNumMaterials =
       (uint)((ulong)((long)(this->_materials).
                            super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_materials).
                           super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ppaVar30 = unique_to_array<aiMaterial>(&this->_materials);
  pScene->mMaterials = ppaVar30;
  pScene->mNumMeshes =
       (uint)((ulong)((long)(this->_meshes).
                            super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_meshes).
                           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  ppaVar31 = unique_to_array<aiMesh>(local_c8);
  pScene->mMeshes = ppaVar31;
  puVar15 = (this->_animations).
            super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)puVar15 -
       (long)(this->_animations).
             super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 8) &&
     (uVar24 = (long)(this->_nodeAnims).
                     super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nodeAnims).
                     super__Vector_base<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar24 != 0)) {
    paVar16 = puVar15[-1]._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
              ._M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
              super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
    paVar16->mNumChannels = (uint)(uVar24 >> 3);
    ppaVar32 = unique_to_array<aiNodeAnim>(&this->_nodeAnims);
    paVar16->mChannels = ppaVar32;
    pScene->mNumAnimations =
         (uint)((ulong)((long)(this->_animations).
                              super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_animations).
                             super__Vector_base<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ppaVar33 = unique_to_array<aiAnimation>(&this->_animations);
    pScene->mAnimations = ppaVar33;
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_148);
  MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_148,pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_1e0);
  FlipWindingOrderProcess::Execute(&local_1e0,pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_1e0);
  MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void B3DImporter::ReadBB3D( aiScene *scene ){

    _textures.clear();

    _materials.clear();

    _vertices.clear();

    _meshes.clear();

    DeleteAllBarePointers(_nodes);
    _nodes.clear();

    _nodeAnims.clear();

    _animations.clear();

    string t=ReadChunk();
    if( t=="BB3D" ){
        int version=ReadInt();

        if (!DefaultLogger::isNullLogger()) {
            char dmp[128];
            ai_snprintf(dmp, 128, "B3D file format version: %i",version);
            ASSIMP_LOG_INFO(dmp);
        }

        while( ChunkSize() ){
            string t=ReadChunk();
            if( t=="TEXS" ){
                ReadTEXS();
            }else if( t=="BRUS" ){
                ReadBRUS();
            }else if( t=="NODE" ){
                ReadNODE( 0 );
            }
            ExitChunk();
        }
    }
    ExitChunk();

    if( !_nodes.size() ) Fail( "No nodes" );

    if( !_meshes.size() ) Fail( "No meshes" );

    //Fix nodes/meshes/bones
    for(size_t i=0;i<_nodes.size();++i ){
        aiNode *node=_nodes[i];

        for( size_t j=0;j<node->mNumMeshes;++j ){
            aiMesh *mesh = _meshes[node->mMeshes[j]].get();

            int n_tris=mesh->mNumFaces;
            int n_verts=mesh->mNumVertices=n_tris * 3;

            aiVector3D *mv=mesh->mVertices=new aiVector3D[ n_verts ],*mn=0,*mc=0;
            if( _vflags & 1 ) mn=mesh->mNormals=new aiVector3D[ n_verts ];
            if( _tcsets ) mc=mesh->mTextureCoords[0]=new aiVector3D[ n_verts ];

            aiFace *face=mesh->mFaces;

            vector< vector<aiVertexWeight> > vweights( _nodes.size() );

            for( int i=0;i<n_verts;i+=3 ){
                for( int j=0;j<3;++j ){
                    Vertex &v=_vertices[face->mIndices[j]];

                    *mv++=v.vertex;
                    if( mn ) *mn++=v.normal;
                    if( mc ) *mc++=v.texcoords;

                    face->mIndices[j]=i+j;

                    for( int k=0;k<4;++k ){
                        if( !v.weights[k] ) break;

                        int bone=v.bones[k];
                        float weight=v.weights[k];

                        vweights[bone].push_back( aiVertexWeight(i+j,weight) );
                    }
                }
                ++face;
            }

            vector<aiBone*> bones;
            for(size_t i=0;i<vweights.size();++i ){
                vector<aiVertexWeight> &weights=vweights[i];
                if( !weights.size() ) continue;

                aiBone *bone=new aiBone;
                bones.push_back( bone );

                aiNode *bnode=_nodes[i];

                bone->mName=bnode->mName;
                bone->mNumWeights= static_cast<unsigned int>(weights.size());
                bone->mWeights=to_array( weights );

                aiMatrix4x4 mat=bnode->mTransformation;
                while( bnode->mParent ){
                    bnode=bnode->mParent;
                    mat=bnode->mTransformation * mat;
                }
                bone->mOffsetMatrix=mat.Inverse();
            }
            mesh->mNumBones= static_cast<unsigned int>(bones.size());
            mesh->mBones=to_array( bones );
        }
    }

    //nodes
    scene->mRootNode=_nodes[0];
    _nodes.clear();  // node ownership now belongs to scene

    //material
    if( !_materials.size() ){
        _materials.emplace_back( std::unique_ptr<aiMaterial>(new aiMaterial) );
    }
    scene->mNumMaterials= static_cast<unsigned int>(_materials.size());
    scene->mMaterials = unique_to_array( _materials );

    //meshes
    scene->mNumMeshes= static_cast<unsigned int>(_meshes.size());
    scene->mMeshes = unique_to_array( _meshes );

    //animations
    if( _animations.size()==1 && _nodeAnims.size() ){

        aiAnimation *anim = _animations.back().get();
        anim->mNumChannels=static_cast<unsigned int>(_nodeAnims.size());
        anim->mChannels = unique_to_array( _nodeAnims );

        scene->mNumAnimations=static_cast<unsigned int>(_animations.size());
        scene->mAnimations=unique_to_array( _animations );
    }

    // convert to RH
    MakeLeftHandedProcess makeleft;
    makeleft.Execute( scene );

    FlipWindingOrderProcess flip;
    flip.Execute( scene );
}